

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddMetadata
          (ContainerMetadataCollection *this,ContainerMetadata metadata)

{
  pointer *ppuVar1;
  iterator iVar2;
  uchar uVar3;
  bool is_inverted;
  undefined8 uStack_18;
  
  if (metadata.container_type == BITSET_CONTAINER) {
    AddContainerType(this,false,false);
    iVar2._M_current =
         (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 iVar2,&stack0xfffffffffffffff7);
    }
    else {
      *iVar2._M_current = 0xf9;
      ppuVar1 = &(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    this->arrays_in_segment = this->arrays_in_segment + 1;
    this->count_in_segment = this->count_in_segment + 1;
    return;
  }
  uStack_18 = (ulong)(uint)metadata & 0xff;
  is_inverted = (bool)(metadata.nulls & 1);
  if ((int)uStack_18 == 0) {
    AddRunContainer(this,(ulong)((uint)metadata >> 0x10),is_inverted);
    return;
  }
  AddContainerType(this,false,is_inverted);
  uVar3 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                    ((ulong)((uint)metadata >> 0x10));
  uStack_18 = CONCAT17(uVar3,(undefined7)uStack_18);
  iVar2._M_current =
       (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               iVar2,(uchar *)((long)&uStack_18 + 7));
  }
  else {
    *iVar2._M_current = uVar3;
    ppuVar1 = &(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  this->arrays_in_segment = this->arrays_in_segment + 1;
  this->count_in_segment = this->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddMetadata(ContainerMetadata metadata) {
	if (metadata.IsRun()) {
		AddRunContainer(metadata.NumberOfRuns(), metadata.IsInverted());
	} else if (metadata.IsUncompressed()) {
		AddBitsetContainer();
	} else {
		AddArrayContainer(metadata.Cardinality(), metadata.IsInverted());
	}
}